

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_device_changed_callback.cpp
# Opt level: O0

void test_registering_and_unregistering_callback(cubeb_stream *stream)

{
  bool bVar1;
  char *pcVar2;
  Message *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int r;
  cubeb_stream *in_stack_ffffffffffffff88;
  Message *in_stack_ffffffffffffff90;
  AssertHelper in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AssertionResult local_50;
  uint local_3c;
  AssertHelper local_38 [2];
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  local_c = cubeb_stream_register_device_changed_callback
                      (in_stack_ffffffffffffff88,(cubeb_device_changed_callback)0x13380a);
  if (local_c != -4) {
    local_24 = 0;
    testing::internal::EqHelper<false>::Compare<int,__0>
              ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98.data_,
               (anon_enum_32 *)in_stack_ffffffffffffff90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
    if (!bVar1) {
      testing::Message::Message(in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff90 =
           testing::Message::operator<<
                     (in_stack_ffffffffffffffa0,(char (*) [42])in_stack_ffffffffffffff98.data_);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x133880);
      testing::internal::AssertHelper::AssertHelper
                (local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_device_changed_callback.cpp"
                 ,0x3f,pcVar2);
      testing::internal::AssertHelper::operator=(local_38,in_stack_ffffffffffffff90);
      testing::internal::AssertHelper::~AssertHelper(local_38);
      testing::Message::~Message((Message *)0x1338c1);
    }
    local_3c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1338dd);
    if (local_3c == 0) {
      local_c = cubeb_stream_register_device_changed_callback
                          (in_stack_ffffffffffffff88,(cubeb_device_changed_callback)0x1338fa);
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)(ulong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                 (int *)in_stack_ffffffffffffff98.data_,(anon_enum_32 *)in_stack_ffffffffffffff90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
      if (!bVar1) {
        testing::Message::Message(in_stack_ffffffffffffffa0);
        message = testing::Message::operator<<
                            (in_stack_ffffffffffffffa0,
                             (char (*) [44])in_stack_ffffffffffffff98.data_);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x133963);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_device_changed_callback.cpp"
                   ,0x42,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff98,message)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
        testing::Message::~Message((Message *)0x1339a3);
      }
      local_3c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1339bf);
    }
  }
  return;
}

Assistant:

void test_registering_and_unregistering_callback(cubeb_stream * stream)
{
  int r = cubeb_stream_register_device_changed_callback(stream, device_changed_callback);
  if (r == CUBEB_ERROR_NOT_SUPPORTED) {
    return;
  }
  ASSERT_EQ(r, CUBEB_OK) << "Error registering device changed callback";

  r = cubeb_stream_register_device_changed_callback(stream, nullptr);
  ASSERT_EQ(r, CUBEB_OK) << "Error unregistering device changed callback";
}